

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O0

bool __thiscall
ON_ArithmeticCalculatorImplementation::AppendArithmeticOperator
          (ON_ArithmeticCalculatorImplementation *this,ARITHMETIC_OP op)

{
  bool bVar1;
  ARITHMETIC_OP AVar2;
  bool rc;
  ARITHMETIC_OP op_local;
  ON_ArithmeticCalculatorImplementation *this_local;
  
  if (this->m_error_condition == '\0') {
    bVar1 = IsEmpty(this);
    if (bVar1) {
      SetErrorCondition(this,invalid_expression_error);
    }
    else if ((this->m_bPendingUnaryPlus == '\0') && (this->m_bPendingUnaryMinus == '\0')) {
      if (this->m_expression_depth == 0) {
        SetErrorCondition(this,invalid_expression_error);
      }
      else if (this->m_op_stack[this->m_op_stack_pointer].m_op == op_number) {
        if (this->m_expression_depth == this->m_op_stack[this->m_op_stack_pointer].m_level) {
          this->m_bPendingImpliedMultiplication = '\0';
          if (((op == op_add || op == op_sub) &&
              (AVar2 = ArithmeticOperationIsPending(this), AVar2 == op_add || AVar2 == op_sub)) &&
             (bVar1 = EvaluatePendingArithmeticOperation(this), !bVar1)) {
            return false;
          }
          this->m_op_stack[this->m_op_stack_pointer].m_op = op;
        }
        else {
          SetErrorCondition(this,invalid_expression_error);
        }
      }
      else {
        SetErrorCondition(this,invalid_expression_error);
      }
    }
    else {
      SetErrorCondition(this,invalid_expression_error);
    }
  }
  return true;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::AppendArithmeticOperator( 
  ON_ArithmeticCalculatorImplementation::ARITHMETIC_OP op 
  )
{
  bool rc = false;

  for(;;)
  {
    if (m_error_condition)
      break;

    if ( IsEmpty() )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( m_bPendingUnaryPlus || m_bPendingUnaryMinus )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( m_expression_depth < 1 )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( ON_ArithmeticCalculatorImplementation::op_number != m_op_stack[m_op_stack_pointer].m_op )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    // specifying an explicit aritimetic operator clears the
    // potential for implied multiplication that occures after
    // a "symbol" value or right parenthesis.
    m_bPendingImpliedMultiplication = false;

    switch( op )
    {
    case ON_ArithmeticCalculatorImplementation::op_add:
    case ON_ArithmeticCalculatorImplementation::op_sub:
      switch(ArithmeticOperationIsPending())
      {
        case ON_ArithmeticCalculatorImplementation::op_add:
        case ON_ArithmeticCalculatorImplementation::op_sub:
          if ( !EvaluatePendingArithmeticOperation() )
            return false;
        break;
        default:
          break;
      }
      break;
    default:
      break;
    }

    m_op_stack[m_op_stack_pointer].m_op = op;
    rc = true;

    break;
  }

  return true;
}